

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBucket::ScanNewImplicitRoots(LargeHeapBucket *this,Recycler *recycler)

{
  LargeHeapBlock *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LargeHeapBlock **ppLVar5;
  
  ppLVar5 = &this->largeBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  ppLVar5 = &this->largePageHeapBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  ppLVar5 = &this->fullLargeBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  ppLVar5 = &this->pendingDisposeLargeBlockList;
  while (pLVar1 = *ppLVar5, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar1,recycler);
    ppLVar5 = &pLVar1->next;
  }
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x240,"(pendingSweepLargeBlockList == nullptr)",
                       "pendingSweepLargeBlockList == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
LargeHeapBucket::ScanNewImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#if ENABLE_CONCURRENT_GC
    Assert(pendingSweepLargeBlockList == nullptr);
#endif
}